

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O3

int CVAhermiteMalloc(CVodeMem cv_mem)

{
  CVadjMemRec *pCVar1;
  CVdtpntMemRec **ppCVar2;
  undefined8 *puVar3;
  bool bVar4;
  N_Vector p_Var5;
  N_Vector *pp_Var6;
  long *__ptr;
  long lVar7;
  int iVar8;
  long lVar9;
  
  pCVar1 = cv_mem->cv_adj_mem;
  p_Var5 = (N_Vector)N_VClone(cv_mem->cv_tempv);
  pCVar1->ca_ytmp = p_Var5;
  iVar8 = 0;
  if (p_Var5 != (N_Vector)0x0) {
    if (pCVar1->ca_IMstoreSensi != 0) {
      pp_Var6 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns,cv_mem->cv_tempv);
      pCVar1->ca_yStmp = pp_Var6;
      if (pp_Var6 == (N_Vector *)0x0) {
        N_VDestroy(pCVar1->ca_ytmp);
        return 0;
      }
    }
    iVar8 = 1;
    if (-1 < pCVar1->ca_nsteps) {
      ppCVar2 = pCVar1->dt_mem;
      lVar9 = 0;
      do {
        __ptr = (long *)malloc(0x20);
        if (__ptr == (long *)0x0) goto LAB_0010d19f;
        lVar7 = N_VClone(cv_mem->cv_tempv);
        *__ptr = lVar7;
        if (lVar7 == 0) {
LAB_0010d197:
          free(__ptr);
LAB_0010d19f:
          N_VDestroy(pCVar1->ca_ytmp);
          if (pCVar1->ca_IMstoreSensi != 0) {
            N_VDestroyVectorArray(pCVar1->ca_yStmp,cv_mem->cv_Ns);
          }
          if (lVar9 != 0) {
            lVar7 = 0;
            do {
              puVar3 = (undefined8 *)ppCVar2[lVar7]->content;
              N_VDestroy(*puVar3);
              N_VDestroy(puVar3[1]);
              if (pCVar1->ca_IMstoreSensi != 0) {
                N_VDestroyVectorArray(puVar3[2],cv_mem->cv_Ns);
                N_VDestroyVectorArray(puVar3[3],cv_mem->cv_Ns);
              }
              free(ppCVar2[lVar7]->content);
              ppCVar2[lVar7]->content = (void *)0x0;
              lVar7 = lVar7 + 1;
            } while (lVar9 != lVar7);
          }
          return 0;
        }
        lVar7 = N_VClone(cv_mem->cv_tempv);
        __ptr[1] = lVar7;
        if (lVar7 == 0) {
          lVar7 = *__ptr;
LAB_0010d170:
          N_VDestroy(lVar7);
          goto LAB_0010d197;
        }
        if (pCVar1->ca_IMstoreSensi != 0) {
          lVar7 = N_VCloneVectorArray(cv_mem->cv_Ns,cv_mem->cv_tempv);
          __ptr[2] = lVar7;
          if (lVar7 == 0) {
            N_VDestroy(*__ptr);
            lVar7 = __ptr[1];
            goto LAB_0010d170;
          }
          lVar7 = N_VCloneVectorArray(cv_mem->cv_Ns,cv_mem->cv_tempv);
          __ptr[3] = lVar7;
          if (lVar7 == 0) {
            N_VDestroy(*__ptr);
            N_VDestroy(__ptr[1]);
            N_VDestroyVectorArray(__ptr[2],cv_mem->cv_Ns);
            goto LAB_0010d197;
          }
        }
        ppCVar2[lVar9]->content = __ptr;
        bVar4 = lVar9 < pCVar1->ca_nsteps;
        lVar9 = lVar9 + 1;
      } while (bVar4);
    }
  }
  return iVar8;
}

Assistant:

static sunbooleantype CVAhermiteMalloc(CVodeMem cv_mem)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVhermiteDataMem content;
  long int i, ii = 0;
  sunbooleantype allocOK;

  allocOK = SUNTRUE;

  ca_mem = cv_mem->cv_adj_mem;

  /* Allocate space for the vectors ytmp and yStmp */

  ca_mem->ca_ytmp = N_VClone(cv_mem->cv_tempv);
  if (ca_mem->ca_ytmp == NULL) { return (SUNFALSE); }

  if (ca_mem->ca_IMstoreSensi)
  {
    ca_mem->ca_yStmp = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempv);
    if (ca_mem->ca_yStmp == NULL)
    {
      N_VDestroy(ca_mem->ca_ytmp);
      return (SUNFALSE);
    }
  }

  /* Allocate space for the content field of the dt structures */

  dt_mem = ca_mem->dt_mem;

  for (i = 0; i <= ca_mem->ca_nsteps; i++)
  {
    content = NULL;
    content = (CVhermiteDataMem)malloc(sizeof(struct CVhermiteDataMemRec));
    if (content == NULL)
    {
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->y = N_VClone(cv_mem->cv_tempv);
    if (content->y == NULL)
    {
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->yd = N_VClone(cv_mem->cv_tempv);
    if (content->yd == NULL)
    {
      N_VDestroy(content->y);
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    if (ca_mem->ca_IMstoreSensi)
    {
      content->yS = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempv);
      if (content->yS == NULL)
      {
        N_VDestroy(content->y);
        N_VDestroy(content->yd);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }

      content->ySd = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempv);
      if (content->ySd == NULL)
      {
        N_VDestroy(content->y);
        N_VDestroy(content->yd);
        N_VDestroyVectorArray(content->yS, cv_mem->cv_Ns);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }
    }

    dt_mem[i]->content = content;
  }

  /* If an error occurred, deallocate and return */

  if (!allocOK)
  {
    N_VDestroy(ca_mem->ca_ytmp);

    if (ca_mem->ca_IMstoreSensi)
    {
      N_VDestroyVectorArray(ca_mem->ca_yStmp, cv_mem->cv_Ns);
    }

    for (i = 0; i < ii; i++)
    {
      content = (CVhermiteDataMem)(dt_mem[i]->content);
      N_VDestroy(content->y);
      N_VDestroy(content->yd);
      if (ca_mem->ca_IMstoreSensi)
      {
        N_VDestroyVectorArray(content->yS, cv_mem->cv_Ns);
        N_VDestroyVectorArray(content->ySd, cv_mem->cv_Ns);
      }
      free(dt_mem[i]->content);
      dt_mem[i]->content = NULL;
    }
  }

  return (allocOK);
}